

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BindMaxAliasingAttributeTest::BindMaxAliasingAttributeTest
          (BindMaxAliasingAttributeTest *this,TestContext *testCtx,RenderContext *renderCtx,
          AttribType *type,int arraySize)

{
  pointer pcVar1;
  deUint32 dVar2;
  long *plVar3;
  long *plVar4;
  long *name;
  long local_a8;
  long lStack_a0;
  TestContext *local_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  string local_50;
  
  local_98 = testCtx;
  gls::(anonymous_namespace)::generateTestName_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)type,(AttribType *)(ulong)(uint)arraySize,(int)type)
  ;
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1cb357c);
  name = &local_a8;
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_a8 = *plVar4;
    lStack_a0 = plVar3[3];
  }
  else {
    local_a8 = *plVar4;
    name = (long *)*plVar3;
  }
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  gls::(anonymous_namespace)::generateTestName_abi_cxx11_
            (&local_70,(_anonymous_namespace_ *)type,(AttribType *)(ulong)(uint)arraySize,
             (int)plVar4);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1cb357c);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar4;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  tcu::TestCase::TestCase(&this->super_TestCase,local_98,(char *)name,(char *)local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (name != &local_a8) {
    operator_delete(name,local_a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BindMaxAliasingAttributeTest_0217c828;
  this->m_renderCtx = renderCtx;
  (this->m_type).m_name._M_dataplus._M_p = (pointer)&(this->m_type).m_name.field_2;
  pcVar1 = (type->m_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_type,pcVar1,pcVar1 + (type->m_name)._M_string_length);
  dVar2 = type->m_glTypeEnum;
  (this->m_type).m_locationSize = type->m_locationSize;
  (this->m_type).m_glTypeEnum = dVar2;
  this->m_arraySize = arraySize;
  return;
}

Assistant:

BindMaxAliasingAttributeTest::BindMaxAliasingAttributeTest (tcu::TestContext&	testCtx,
															glu::RenderContext&	renderCtx,
															const AttribType&	type,
															int					arraySize)
	: TestCase		(testCtx, ("max_cond_" + generateTestName(type, arraySize)).c_str(), ("max_cond_" + generateTestName(type, arraySize)).c_str())
	, m_renderCtx	(renderCtx)
	, m_type		(type)
	, m_arraySize	(arraySize)
{
}